

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

HighsStatus assessHessianDimensions(HighsOptions *options,HighsHessian *hessian)

{
  HighsStatus HVar1;
  vector<int,_std::allocator<int>_> hessian_p_end;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  if (hessian->dim_ == 0) {
    HVar1 = kOk;
  }
  else {
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVar1 = assessMatrixDimensions
                      (&(options->super_HighsOptionsStruct).log_options,hessian->dim_,false,
                       &hessian->start_,(vector<int,_std::allocator<int>_> *)&local_28,
                       &hessian->index_,&hessian->value_);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  }
  return HVar1;
}

Assistant:

HighsStatus assessHessianDimensions(const HighsOptions& options,
                                    HighsHessian& hessian) {
  if (hessian.dim_ == 0) return HighsStatus::kOk;

  // Assess the Hessian dimensions and vector sizes
  vector<HighsInt> hessian_p_end;
  const bool partitioned = false;
  return assessMatrixDimensions(options.log_options, hessian.dim_, partitioned,
                                hessian.start_, hessian_p_end, hessian.index_,
                                hessian.value_);
}